

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::ViewportArray::DrawTestBase::iterate(DrawTestBase *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  deUint32 dVar4;
  NotSupportedError *this_00;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_01;
  GLchar *fragment_shader_code;
  GLchar *geometry_shader_code;
  GLchar *vertex_shader_code;
  TestContext *pTVar6;
  socklen_t sVar7;
  sockaddr *__addr;
  sockaddr *__addr_00;
  Context *context;
  undefined1 *puVar8;
  int local_4f8;
  bool result_1;
  float fStack_4ec;
  bool result;
  byte local_4e5;
  GLfloat depth_value;
  undefined1 local_4e0 [3];
  bool is_clear;
  GLuint draw_call;
  framebuffer framebuffer;
  texture texture_1;
  texture texture_0;
  undefined1 local_488 [4];
  GLuint i;
  vertexArray vao;
  MessageBuilder message;
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  program program;
  string vertex;
  string geometry;
  string fragment;
  GLchar *vert_template;
  GLchar *geom_template;
  GLchar *frag_template;
  GLchar **local_a8;
  string *vert;
  string **local_80;
  string *geom;
  string **local_58;
  string *frag;
  GLfloat local_48;
  GLuint n_iterations;
  GLuint n_draw_calls;
  TEST_TYPE test_type;
  bool test_result;
  ApiType *pAStack_38;
  ContextType *context_type;
  Functions *gl;
  DrawTestBase *local_18;
  DrawTestBase *this_local;
  
  local_18 = this;
  if (((this->super_TestCaseBase).m_is_viewport_array_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Viewport array functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
               ,0x9dd);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  context_type = (ContextType *)CONCAT44(extraout_var,iVar2);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  test_type = (*pRVar5->_vptr_RenderContext[2])();
  pAStack_38 = (ApiType *)&test_type;
  n_draw_calls._3_1_ = 1;
  n_iterations = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])();
  local_48 = (GLfloat)(*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])
                                ();
  frag._4_4_ = 0;
  if (n_iterations < 2) {
    frag._4_4_ = 3;
  }
  else {
    if (1 < n_iterations - 2) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0x9f6);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    frag._4_4_ = 2;
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  local_58 = &geom;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])(&vert);
  local_80 = &vert;
  getVertexShader_abi_cxx11_((string *)&frag_template,this);
  local_a8 = &frag_template;
  geom_template = (GLchar *)std::__cxx11::string::c_str();
  vert_template = (GLchar *)std::__cxx11::string::c_str();
  fragment.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&geometry.field_2 + 8),&this->super_TestCaseBase,1,&geom_template);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)((long)&vertex.field_2 + 8),&this->super_TestCaseBase,1,&vert_template);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&program.m_context,&this->super_TestCaseBase,1,
             (char **)((long)&fragment.field_2 + 8));
  Utils::program::program((program *)&exc_1,(this->super_TestCaseBase).m_context);
  fragment_shader_code = (GLchar *)std::__cxx11::string::c_str();
  geometry_shader_code = (GLchar *)std::__cxx11::string::c_str();
  vertex_shader_code = (GLchar *)std::__cxx11::string::c_str();
  Utils::program::build
            ((program *)&exc_1,(GLchar *)0x0,fragment_shader_code,geometry_shader_code,(GLchar *)0x0
             ,(GLchar *)0x0,vertex_shader_code,(GLchar **)0x0,0,false);
  sVar7 = (socklen_t)geometry_shader_code;
  Utils::program::use((program *)&exc_1);
  context = (this->super_TestCaseBase).m_context;
  Utils::vertexArray::vertexArray((vertexArray *)local_488,context);
  iVar2 = (int)context;
  Utils::vertexArray::generate((vertexArray *)local_488);
  Utils::vertexArray::bind((vertexArray *)local_488,iVar2,__addr,sVar7);
  texture_0._28_4_ = 0;
  do {
    if (frag._4_4_ <= (uint)texture_0._28_4_) {
LAB_0170d76c:
      if ((n_draw_calls._3_1_ & 1) == 1) {
        pTVar6 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
        tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        pTVar6 = deqp::Context::getTestContext((this->super_TestCaseBase).m_context);
        tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_FAIL,"Fail");
      }
      this_local._4_4_ = STOP;
LAB_0170d7f5:
      Utils::vertexArray::~vertexArray((vertexArray *)local_488);
      Utils::program::~program((program *)&exc_1);
      std::__cxx11::string::~string((string *)&program.m_context);
      std::__cxx11::string::~string((string *)(vertex.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(geometry.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&frag_template);
      std::__cxx11::string::~string((string *)&vert);
      std::__cxx11::string::~string((string *)&geom);
      return this_local._4_4_;
    }
    Utils::texture::texture((texture *)&texture_1.m_is_array,(this->super_TestCaseBase).m_context);
    Utils::texture::texture((texture *)&framebuffer.m_context,(this->super_TestCaseBase).m_context);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
              (this,&texture_1.m_is_array,&framebuffer.m_context);
    Utils::framebuffer::framebuffer((framebuffer *)local_4e0,(this->super_TestCaseBase).m_context);
    Utils::framebuffer::generate((framebuffer *)local_4e0);
    puVar8 = local_4e0;
    sVar7 = (socklen_t)&framebuffer.m_context;
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
              (this,puVar8,&texture_1.m_is_array);
    Utils::framebuffer::bind((framebuffer *)local_4e0,(int)puVar8,__addr_00,sVar7);
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
              (this,(ulong)n_iterations,(ulong)(uint)texture_0._28_4_);
    uVar3 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])();
    if ((uVar3 & 1) == 0) {
      for (depth_value = 0.0; (uint)depth_value < (uint)local_48;
          depth_value = (GLfloat)((int)depth_value + 1)) {
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                  (this,&exc_1,(ulong)(uint)depth_value);
        (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,&local_4e5,(ulong)(uint)depth_value,&stack0xfffffffffffffb14);
        if ((local_4e5 & 1) == 1) {
          bVar1 = glu::isContextTypeGLCore((ContextType)pAStack_38->m_bits);
          if (bVar1) {
            (**(code **)(context_type + 0x72))((double)fStack_4ec);
          }
          else {
            (**(code **)(context_type + 0x74))(fStack_4ec);
          }
          dVar4 = (**(code **)(context_type + 0x200))();
          glu::checkError(dVar4,"ClearDepth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa53);
          (**(code **)(context_type + 0x62))(0x100);
          dVar4 = (**(code **)(context_type + 0x200))();
          glu::checkError(dVar4,"Clear",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0xa56);
        }
        (**(code **)(context_type + 0x14e))(0,0,1);
        dVar4 = (**(code **)(context_type + 0x200))();
        glu::checkError(dVar4,"DrawArrays",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0xa5a);
        uVar3 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                          (this,&texture_1.m_is_array,&framebuffer.m_context,
                           (ulong)(uint)depth_value);
        if ((uVar3 & 1) == 0) {
          n_draw_calls._3_1_ = 0;
          local_4f8 = 9;
          goto LAB_0170d6f1;
        }
      }
LAB_0170d6e7:
      local_4f8 = 0;
    }
    else {
      (**(code **)(context_type + 0x70))(0,0,0);
      dVar4 = (**(code **)(context_type + 0x200))();
      glu::checkError(dVar4,"ClearColor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xa68);
      (**(code **)(context_type + 0x62))(0x4000);
      dVar4 = (**(code **)(context_type + 0x200))();
      glu::checkError(dVar4,"Clear",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xa6b);
      uVar3 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])
                        (this,&texture_1.m_is_array,&framebuffer.m_context,0);
      if ((uVar3 & 1) != 0) goto LAB_0170d6e7;
      n_draw_calls._3_1_ = 0;
      local_4f8 = 9;
    }
LAB_0170d6f1:
    Utils::framebuffer::~framebuffer((framebuffer *)local_4e0);
    Utils::texture::~texture((texture *)&framebuffer.m_context);
    Utils::texture::~texture((texture *)&texture_1.m_is_array);
    if (local_4f8 != 0) {
      if (local_4f8 != 9) goto LAB_0170d7f5;
      goto LAB_0170d76c;
    }
    texture_0._28_4_ = texture_0._28_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawTestBase::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions&   gl			 = m_context.getRenderContext().getFunctions();
	const glu::ContextType& context_type = m_context.getRenderContext().getType();

	/* Test result */
	bool test_result = true;

	/* Get type of test */
	const TEST_TYPE test_type = getTestType();

	GLuint n_draw_calls = getDrawCallsNumber();
	GLuint n_iterations = 0;
	switch (test_type)
	{
	case VIEWPORT:
	case SCISSOR:
		n_iterations = 3;
		break;
	case DEPTHRANGE:
	case PROVOKING:
		n_iterations = 2;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Get shader sources and specialize them */
	const std::string& frag = getFragmentShader();
	const std::string& geom = getGeometryShader();
	const std::string& vert = getVertexShader();

	const GLchar* frag_template = frag.c_str();
	const GLchar* geom_template = geom.c_str();
	const GLchar* vert_template = vert.c_str();

	std::string fragment = specializeShader(1, &frag_template);
	std::string geometry = specializeShader(1, &geom_template);
	std::string vertex   = specializeShader(1, &vert_template);

	/* Prepare program */
	Utils::program program(m_context);

	try
	{
		program.build(0 /* compute */, fragment.c_str(), geometry.c_str(), 0 /* tess ctrl */, 0 /* tess eval */,
					  vertex.c_str(), 0 /* varying names */, 0 /* n_varyings */);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source.c_str(), message);

		message << tcu::TestLog::EndMessage;

		TCU_FAIL("Shader compilation failed");
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		TCU_FAIL("Program linking failed");
	}

	program.use();

	/* Prepare VAO */
	Utils::vertexArray vao(m_context);
	vao.generate();
	vao.bind();

	/* For each iteration from test type */
	for (GLuint i = 0; i < n_iterations; ++i)
	{
		/* Prepare textures */
		Utils::texture texture_0(m_context);
		Utils::texture texture_1(m_context);

		prepareTextures(texture_0, texture_1);

		/* Prepare framebuffer */
		Utils::framebuffer framebuffer(m_context);
		framebuffer.generate();
		setupFramebuffer(framebuffer, texture_0, texture_1);
		framebuffer.bind();

		/* Set up viewports */
		setupViewports(test_type, i);

		if (false == isClearTest())
		{
			/* For each draw call */
			for (GLuint draw_call = 0; draw_call < n_draw_calls; ++draw_call)
			{
				prepareUniforms(program, draw_call);

				bool	is_clear;
				GLfloat depth_value;

				getClearSettings(is_clear, draw_call, depth_value);

				if (true == is_clear)
				{
					if (glu::isContextTypeGLCore(context_type))
					{
						gl.clearDepth((GLdouble)depth_value);
					}
					else
					{
						gl.clearDepthf(depth_value);
					}
					GLU_EXPECT_NO_ERROR(gl.getError(), "ClearDepth");

					gl.clear(GL_DEPTH_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");
				}

				gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

				bool result = checkResults(texture_0, texture_1, draw_call);

				if (false == result)
				{
					test_result = false;
					goto end;
				}
			}
		}
		else
		{
			gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ClearColor");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Clear");

			bool result = checkResults(texture_0, texture_1, 0);

			if (false == result)
			{
				test_result = false;
				goto end;
			}
		}
	}

end:
	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}